

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          CodedInputStream *input,FieldSkipper *field_skipper)

{
  FieldType FVar1;
  bool bVar2;
  int iVar3;
  LogMessage *other;
  MessageLite *pMVar4;
  string *value_00;
  FieldDescriptor *pFVar5;
  int64 iVar6;
  uint64 uVar7;
  undefined7 in_register_00000011;
  int32 value;
  undefined4 uStack_74;
  LogFinisher local_39;
  Limit local_38;
  uint32 size;
  
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    bVar2 = io::CodedInputStream::ReadVarint32(input,&size);
    if (!bVar2) {
      return false;
    }
    local_38 = io::CodedInputStream::PushLimit(input,size);
    switch(extension->type) {
    case '\x01':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,(double *)&value);
        if (!bVar2) {
          return false;
        }
        AddDouble(this,number,'\x01',extension->is_packed,(double)CONCAT44(uStack_74,value),
                  extension->descriptor);
      }
      break;
    case '\x02':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,(float *)&value);
        if (!bVar2) {
          return false;
        }
        AddFloat(this,number,'\x02',extension->is_packed,(float)value,extension->descriptor);
      }
      break;
    case '\x03':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,(int64 *)&value);
        if (!bVar2) {
          return false;
        }
        AddInt64(this,number,'\x03',extension->is_packed,CONCAT44(uStack_74,value),
                 extension->descriptor);
      }
      break;
    case '\x04':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&value);
        if (!bVar2) {
          return false;
        }
        AddUInt64(this,number,'\x04',extension->is_packed,CONCAT44(uStack_74,value),
                  extension->descriptor);
      }
      break;
    case '\x05':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&value);
        if (!bVar2) {
          return false;
        }
        AddInt32(this,number,'\x05',extension->is_packed,value,extension->descriptor);
      }
      break;
    case '\x06':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&value);
        if (!bVar2) {
          return false;
        }
        AddUInt64(this,number,'\x06',extension->is_packed,CONCAT44(uStack_74,value),
                  extension->descriptor);
      }
      break;
    case '\a':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&value);
        if (!bVar2) {
          return false;
        }
        AddUInt32(this,number,'\a',extension->is_packed,value,extension->descriptor);
      }
      break;
    case '\b':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,(bool *)&value);
        if (!bVar2) {
          return false;
        }
        AddBool(this,number,'\b',extension->is_packed,value._0_1_,extension->descriptor);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                ((LogMessage *)&value,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x4c5);
      other = LogMessage::operator<<((LogMessage *)&value,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_39,other);
      LogMessage::~LogMessage((LogMessage *)&value);
      break;
    case '\r':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&value);
        if (!bVar2) {
          return false;
        }
        AddUInt32(this,number,'\r',extension->is_packed,value,extension->descriptor);
      }
      break;
    case '\x0e':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&value);
        if (!bVar2) {
          return false;
        }
        bVar2 = (*(extension->field_3).enum_validity_check.func)
                          ((extension->field_3).enum_validity_check.arg,value);
        if (bVar2) {
          AddEnum(this,number,'\x0e',extension->is_packed,value,extension->descriptor);
        }
        else {
          (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)(uint)value);
        }
      }
      break;
    case '\x0f':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                          (input,&value);
        if (!bVar2) {
          return false;
        }
        AddInt32(this,number,'\x0f',extension->is_packed,value,extension->descriptor);
      }
      break;
    case '\x10':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                          (input,(int64 *)&value);
        if (!bVar2) {
          return false;
        }
        AddInt64(this,number,'\x10',extension->is_packed,CONCAT44(uStack_74,value),
                 extension->descriptor);
      }
      break;
    case '\x11':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                          (input,&value);
        if (!bVar2) {
          return false;
        }
        AddInt32(this,number,'\x11',extension->is_packed,value,extension->descriptor);
      }
      break;
    case '\x12':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                          (input,(int64 *)&value);
        if (!bVar2) {
          return false;
        }
        AddInt64(this,number,'\x12',extension->is_packed,CONCAT44(uStack_74,value),
                 extension->descriptor);
      }
    }
    io::CodedInputStream::PopLimit(input,local_38);
    return true;
  }
  switch(extension->type) {
  case '\x01':
    bVar2 = WireFormatLite::
            ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      (input,(double *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,(double)CONCAT44(uStack_74,value),
                extension->descriptor);
      return true;
    }
    SetDouble(this,number,'\x01',(double)CONCAT44(uStack_74,value),extension->descriptor);
    return true;
  case '\x02':
    bVar2 = WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      (input,(float *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,(float)value,extension->descriptor);
    }
    else {
      SetFloat(this,number,'\x02',(float)value,extension->descriptor);
    }
    break;
  case '\x03':
    bVar2 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                      (input,(int64 *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      iVar6 = CONCAT44(uStack_74,value);
      pFVar5 = extension->descriptor;
      FVar1 = '\x03';
LAB_0033ea7c:
      SetInt64(this,number,FVar1,iVar6,pFVar5);
      return true;
    }
    bVar2 = extension->is_packed;
    iVar6 = CONCAT44(uStack_74,value);
    pFVar5 = extension->descriptor;
    FVar1 = '\x03';
    goto LAB_0033e46f;
  case '\x04':
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      uVar7 = CONCAT44(uStack_74,value);
      pFVar5 = extension->descriptor;
      FVar1 = '\x04';
LAB_0033ea93:
      SetUInt64(this,number,FVar1,uVar7,pFVar5);
      return true;
    }
    bVar2 = extension->is_packed;
    uVar7 = CONCAT44(uStack_74,value);
    pFVar5 = extension->descriptor;
    FVar1 = '\x04';
    goto LAB_0033e4ac;
  case '\x05':
    bVar2 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (input,&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\x05';
LAB_0033e9e6:
      SetInt32(this,number,FVar1,value,pFVar5);
      return true;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\x05';
    goto LAB_0033e2c9;
  case '\x06':
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      uVar7 = CONCAT44(uStack_74,value);
      pFVar5 = extension->descriptor;
      FVar1 = '\x06';
      goto LAB_0033ea93;
    }
    bVar2 = extension->is_packed;
    uVar7 = CONCAT44(uStack_74,value);
    pFVar5 = extension->descriptor;
    FVar1 = '\x06';
LAB_0033e4ac:
    AddUInt64(this,number,FVar1,bVar2,uVar7,pFVar5);
    break;
  case '\a':
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\a';
LAB_0033eaba:
      SetUInt32(this,number,FVar1,value,pFVar5);
      return true;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\a';
    goto LAB_0033e539;
  case '\b':
    bVar2 = WireFormatLite::
            ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                      (input,(bool *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,value._0_1_,extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',value._0_1_,extension->descriptor);
    }
    break;
  case '\t':
    pFVar5 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\t';
      goto LAB_0033e962;
    }
    FVar1 = '\t';
LAB_0033e57f:
    value_00 = AddString_abi_cxx11_(this,number,FVar1,pFVar5);
    goto LAB_0033e96d;
  case '\n':
    if (extension->is_repeated == true) {
      pMVar4 = AddMessage(this,number,'\n',(extension->field_3).message_prototype,
                          extension->descriptor);
    }
    else {
      pMVar4 = MutableMessage(this,number,'\n',(extension->field_3).message_prototype,
                              extension->descriptor);
    }
    bVar2 = WireFormatLite::ReadGroup(number,input,pMVar4);
    goto LAB_0033e978;
  case '\v':
    if (extension->is_repeated == true) {
      pMVar4 = AddMessage(this,number,'\v',(extension->field_3).message_prototype,
                          extension->descriptor);
    }
    else {
      pMVar4 = MutableMessage(this,number,'\v',(extension->field_3).message_prototype,
                              extension->descriptor);
    }
    bVar2 = WireFormatLite::ReadMessage(input,pMVar4);
    goto LAB_0033e978;
  case '\f':
    pFVar5 = extension->descriptor;
    if (extension->is_repeated == true) {
      FVar1 = '\f';
      goto LAB_0033e57f;
    }
    FVar1 = '\f';
LAB_0033e962:
    value_00 = MutableString_abi_cxx11_(this,number,FVar1,pFVar5);
LAB_0033e96d:
    bVar2 = WireFormatLite::ReadBytes(input,value_00);
LAB_0033e978:
    if (bVar2 == false) {
      return false;
    }
    break;
  case '\r':
    bVar2 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\r';
      goto LAB_0033eaba;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\r';
LAB_0033e539:
    AddUInt32(this,number,FVar1,bVar2,value,pFVar5);
    break;
  case '\x0e':
    bVar2 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                      (input,&value);
    if (!bVar2) {
      return false;
    }
    bVar2 = (*(extension->field_3).enum_validity_check.func)
                      ((extension->field_3).enum_validity_check.arg,value);
    if (bVar2) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,value,extension->descriptor);
      }
      else {
        SetEnum(this,number,'\x0e',value,extension->descriptor);
      }
    }
    else {
      (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)(uint)value);
    }
    break;
  case '\x0f':
    bVar2 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                      (input,&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\x0f';
      goto LAB_0033e9e6;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\x0f';
    goto LAB_0033e2c9;
  case '\x10':
    bVar2 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                      (input,(int64 *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      iVar6 = CONCAT44(uStack_74,value);
      pFVar5 = extension->descriptor;
      FVar1 = '\x10';
      goto LAB_0033ea7c;
    }
    bVar2 = extension->is_packed;
    iVar6 = CONCAT44(uStack_74,value);
    pFVar5 = extension->descriptor;
    FVar1 = '\x10';
    goto LAB_0033e46f;
  case '\x11':
    bVar2 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                      (input,&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\x11';
      goto LAB_0033e9e6;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\x11';
LAB_0033e2c9:
    AddInt32(this,number,FVar1,bVar2,value,pFVar5);
    break;
  case '\x12':
    bVar2 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                      (input,(int64 *)&value);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      iVar6 = CONCAT44(uStack_74,value);
      pFVar5 = extension->descriptor;
      FVar1 = '\x12';
      goto LAB_0033ea7c;
    }
    bVar2 = extension->is_packed;
    iVar6 = CONCAT44(uStack_74,value);
    pFVar5 = extension->descriptor;
    FVar1 = '\x12';
LAB_0033e46f:
    AddInt64(this,number,FVar1,bVar2,iVar6,pFVar5);
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    io::CodedInputStream* input,
    FieldSkipper* field_skipper) {
  // Explicitly not read extension.is_packed, instead check whether the field
  // was encoded in packed form on the wire.
  if (was_packed_on_wire) {
    uint32 size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)        \
      case WireFormatLite::TYPE_##UPPERCASE:                                   \
        while (input->BytesUntilLimit() > 0) {                                 \
          CPP_LOWERCASE value;                                                 \
          if (!WireFormatLite::ReadPrimitive<                                  \
                  CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(            \
                input, &value)) return false;                                  \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             extension.is_packed, value,                       \
                             extension.descriptor);                            \
        }                                                                      \
        break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value)) return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed,
                    value, extension.descriptor);
          } else {
            // Invalid value.  Treat as unknown.
            field_skipper->SkipUnknownEnum(number, value);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                   \
      case WireFormatLite::TYPE_##UPPERCASE: {                                 \
        CPP_LOWERCASE value;                                                   \
        if (!WireFormatLite::ReadPrimitive<                                    \
                CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(              \
               input, &value)) return false;                                   \
        if (extension.is_repeated) {                                           \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             extension.is_packed, value,                       \
                             extension.descriptor);                            \
        } else {                                                               \
          Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,  \
                             extension.descriptor);                            \
        }                                                                      \
      } break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value)) return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_STRING, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_STRING,
                        extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_BYTES, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_BYTES,
                        extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_GROUP,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_GROUP,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}